

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

hugeint_t __thiscall
duckdb::Interpolator<false>::
Interpolate<unsigned_long,duckdb::hugeint_t,duckdb::QuantileIndirect<duckdb::hugeint_t>>
          (Interpolator<false> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<duckdb::hugeint_t> *accessor)

{
  DataChunk *pDVar1;
  CURSOR *pCVar2;
  duckdb *pdVar3;
  uint64_t uVar4;
  bool bVar5;
  reference pvVar6;
  InvalidInputException *pIVar7;
  int64_t iVar8;
  uint uVar9;
  hugeint_t input;
  hugeint_t input_00;
  hugeint_t input_01;
  hugeint_t hVar10;
  hugeint_t input_02;
  hugeint_t input_03;
  hugeint_t input_04;
  hugeint_t result_1;
  hugeint_t local_78;
  string local_68;
  hugeint_t local_48;
  
  if (lidx == hidx) {
    pCVar2 = accessor->data;
    if (((pCVar2->scan).next_row_index <= lidx) || (lidx < (pCVar2->scan).current_row_index)) {
      pDVar1 = &pCVar2->page;
      ColumnDataCollection::Seek(pCVar2->inputs,lidx,&pCVar2->scan,pDVar1);
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar2->data = (hugeint_t *)pvVar6->data;
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar6);
      pCVar2->validity = &pvVar6->validity;
    }
    uVar9 = (int)lidx - (int)(pCVar2->scan).current_row_index;
    pdVar3 = (duckdb *)pCVar2->data[uVar9].lower;
    uVar4 = pCVar2->data[uVar9].upper;
    iVar8 = 0;
    input.upper = uVar4;
    input.lower = (uint64_t)pdVar3;
    bVar5 = TryCast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(input,&local_78,false);
    if (!bVar5) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_02.upper = iVar8;
      input_02.lower = uVar4;
      CastExceptionText<duckdb::hugeint_t,duckdb::hugeint_t>(&local_68,pdVar3,input_02);
      InvalidInputException::InvalidInputException(pIVar7,(string *)&local_68);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    hVar10.upper = local_78.upper;
    hVar10.lower = local_78.lower;
  }
  else {
    pCVar2 = accessor->data;
    if (((pCVar2->scan).next_row_index <= lidx) || (lidx < (pCVar2->scan).current_row_index)) {
      pDVar1 = &pCVar2->page;
      ColumnDataCollection::Seek(pCVar2->inputs,lidx,&pCVar2->scan,pDVar1);
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar2->data = (hugeint_t *)pvVar6->data;
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar6);
      pCVar2->validity = &pvVar6->validity;
    }
    uVar9 = (int)lidx - (int)(pCVar2->scan).current_row_index;
    pdVar3 = (duckdb *)pCVar2->data[uVar9].lower;
    uVar4 = pCVar2->data[uVar9].upper;
    iVar8 = 0;
    input_00.upper = uVar4;
    input_00.lower = (uint64_t)pdVar3;
    bVar5 = TryCast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(input_00,&local_78,false);
    if (!bVar5) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_03.upper = iVar8;
      input_03.lower = uVar4;
      CastExceptionText<duckdb::hugeint_t,duckdb::hugeint_t>(&local_68,pdVar3,input_03);
      InvalidInputException::InvalidInputException(pIVar7,(string *)&local_68);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_48.lower = local_78.lower;
    local_48.upper = local_78.upper;
    pCVar2 = accessor->data;
    if (((pCVar2->scan).next_row_index <= hidx) || (hidx < (pCVar2->scan).current_row_index)) {
      pDVar1 = &pCVar2->page;
      ColumnDataCollection::Seek(pCVar2->inputs,hidx,&pCVar2->scan,pDVar1);
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar2->data = (hugeint_t *)pvVar6->data;
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar6);
      pCVar2->validity = &pvVar6->validity;
    }
    uVar9 = (int)hidx - (int)(pCVar2->scan).current_row_index;
    pdVar3 = (duckdb *)pCVar2->data[uVar9].lower;
    uVar4 = pCVar2->data[uVar9].upper;
    iVar8 = 0;
    input_01.upper = uVar4;
    input_01.lower = (uint64_t)pdVar3;
    bVar5 = TryCast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(input_01,&local_78,false);
    if (!bVar5) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_04.upper = iVar8;
      input_04.lower = uVar4;
      CastExceptionText<duckdb::hugeint_t,duckdb::hugeint_t>(&local_68,pdVar3,input_04);
      InvalidInputException::InvalidInputException(pIVar7,(string *)&local_68);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_68._M_dataplus._M_p = (pointer)local_78.lower;
    local_68._M_string_length = local_78.upper;
    hVar10 = CastInterpolation::Interpolate<duckdb::hugeint_t>
                       (&local_48,
                        this->RN -
                        (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                         1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0)),
                        (hugeint_t *)&local_68);
  }
  return hVar10;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		if (lidx == hidx) {
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
		} else {
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(hidx), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}